

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O3

void __thiscall xemmai::ast::t_for::f_flow(t_for *this,t_flow *a_flow)

{
  t_block *a_next;
  t_block *a_next_00;
  pointer puVar1;
  t_node *ptVar2;
  t_targets *ptVar3;
  t_block *ptVar4;
  unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *p_1;
  t_block *ptVar5;
  pointer puVar6;
  unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *p;
  t_targets targets1;
  t_targets local_48;
  
  puVar1 = (this->v_initialization).
           super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar6 = (this->v_initialization).
                super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar1; puVar6 = puVar6 + 1) {
    ptVar2 = (puVar6->_M_t).
             super___uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>.
             _M_t.
             super__Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>
             .super__Head_base<0UL,_xemmai::ast::t_node_*,_false>._M_head_impl;
    (*ptVar2->_vptr_t_node[2])(ptVar2,a_flow);
  }
  a_next = &this->v_junction_condition;
  t_block::f_next(a_flow->v_current,a_next);
  ptVar5 = &this->v_block_condition;
  t_block::f_next(a_next,ptVar5);
  a_flow->v_current = ptVar5;
  ptVar2 = (this->v_condition)._M_t.
           super___uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>.
           _M_t.
           super__Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>.
           super__Head_base<0UL,_xemmai::ast::t_node_*,_false>._M_head_impl;
  if (ptVar2 != (t_node *)0x0) {
    (*ptVar2->_vptr_t_node[2])(ptVar2,a_flow);
    ptVar5 = a_flow->v_current;
  }
  ptVar4 = &this->v_block_block;
  t_block::f_next(ptVar5,ptVar4);
  ptVar5 = &this->v_junction_exit;
  t_block::f_next(a_flow->v_current,ptVar5);
  ptVar3 = a_flow->v_targets;
  a_next_00 = &this->v_junction_next;
  local_48.v_return = ptVar3->v_return;
  a_flow->v_targets = &local_48;
  a_flow->v_current = ptVar4;
  puVar6 = (this->v_block).
           super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->v_block).
           super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_48.v_break = ptVar5;
  local_48.v_continue = a_next_00;
  if (puVar6 != puVar1) {
    do {
      ptVar2 = (puVar6->_M_t).
               super___uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>
               ._M_t.
               super__Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>
               .super__Head_base<0UL,_xemmai::ast::t_node_*,_false>._M_head_impl;
      (*ptVar2->_vptr_t_node[2])(ptVar2,a_flow);
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar1);
    ptVar4 = a_flow->v_current;
  }
  a_flow->v_targets = ptVar3;
  t_block::f_next(ptVar4,a_next_00);
  ptVar4 = &this->v_block_next;
  t_block::f_next(a_next_00,ptVar4);
  a_flow->v_current = ptVar4;
  puVar6 = (this->v_next).
           super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->v_next).
           super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar6 != puVar1) {
    do {
      ptVar2 = (puVar6->_M_t).
               super___uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>
               ._M_t.
               super__Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>
               .super__Head_base<0UL,_xemmai::ast::t_node_*,_false>._M_head_impl;
      (*ptVar2->_vptr_t_node[2])(ptVar2,a_flow);
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar1);
    ptVar4 = a_flow->v_current;
  }
  t_block::f_next(ptVar4,a_next);
  t_block::f_next(ptVar5,&this->v_block_exit);
  a_flow->v_current = &this->v_block_exit;
  return;
}

Assistant:

void t_for::f_flow(t_flow& a_flow)
{
	for (auto& p : v_initialization) p->f_flow(a_flow);
	a_flow.v_current->f_next(&v_junction_condition);
	v_junction_condition.f_next(&v_block_condition);
	a_flow.v_current = &v_block_condition;
	if (v_condition) v_condition->f_flow(a_flow);
	a_flow.v_current->f_next(&v_block_block);
	a_flow.v_current->f_next(&v_junction_exit);
	auto targets0 = a_flow.v_targets;
	t_flow::t_targets targets1{&v_junction_exit, &v_junction_next, targets0->v_return};
	a_flow.v_targets = &targets1;
	a_flow.v_current = &v_block_block;
	for (auto& p : v_block) p->f_flow(a_flow);
	a_flow.v_targets = targets0;
	a_flow.v_current->f_next(&v_junction_next);
	v_junction_next.f_next(&v_block_next);
	a_flow.v_current = &v_block_next;
	for (auto& p : v_next) p->f_flow(a_flow);
	a_flow.v_current->f_next(&v_junction_condition);
	v_junction_exit.f_next(&v_block_exit);
	a_flow.v_current = &v_block_exit;
}